

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.cpp
# Opt level: O3

void __thiscall rw::BBox::calculate(BBox *this,V3d *points,int32 n)

{
  float fVar1;
  int iVar2;
  float32 *pfVar3;
  float32 fVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  
  (this->inf).z = points->z;
  fVar4 = points->y;
  (this->inf).x = points->x;
  (this->inf).y = fVar4;
  fVar4 = points->y;
  (this->sup).x = points->x;
  (this->sup).y = fVar4;
  (this->sup).z = points->z;
  iVar2 = n + -1;
  if (iVar2 != 0) {
    fVar4 = (this->sup).x;
    fVar5 = (this->sup).y;
    fVar6 = (this->inf).x;
    fVar7 = (this->inf).y;
    fVar8 = (this->inf).z;
    fVar9 = (this->sup).z;
    pfVar3 = &points[1].z;
    do {
      fVar1 = (float)((V3d *)(pfVar3 + -2))->x;
      if (fVar1 < (float)fVar6) {
        (this->inf).x = (float32)fVar1;
        fVar6 = (float32)fVar1;
      }
      fVar1 = (float)pfVar3[-1];
      if (fVar1 < (float)fVar7) {
        (this->inf).y = (float32)fVar1;
        fVar7 = (float32)fVar1;
      }
      fVar1 = (float)*pfVar3;
      if (fVar1 < (float)fVar8) {
        (this->inf).z = (float32)fVar1;
        fVar8 = (float32)fVar1;
      }
      fVar1 = (float)((V3d *)(pfVar3 + -2))->x;
      if ((float)fVar4 < fVar1) {
        (this->sup).x = (float32)fVar1;
        fVar4 = (float32)fVar1;
      }
      fVar1 = (float)pfVar3[-1];
      if ((float)fVar5 < fVar1) {
        (this->sup).y = (float32)fVar1;
        fVar5 = (float32)fVar1;
      }
      fVar1 = (float)*pfVar3;
      if ((float)fVar9 < fVar1) {
        (this->sup).z = (float32)fVar1;
        fVar9 = (float32)fVar1;
      }
      pfVar3 = pfVar3 + 3;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void
BBox::calculate(V3d *points, int32 n)
{
	this->inf = points[0];
	this->sup = points[0];
	while(--n){
		points++;
		if(points->x < this->inf.x)
			this->inf.x = points->x;
		if(points->y < this->inf.y)
			this->inf.y = points->y;
		if(points->z < this->inf.z)
			this->inf.z = points->z;
		if(points->x > this->sup.x)
			this->sup.x = points->x;
		if(points->y > this->sup.y)
			this->sup.y = points->y;
		if(points->z > this->sup.z)
			this->sup.z = points->z;
	}
}